

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeNumberCheck
          (Interpreter *this,LocationRange *loc,double v)

{
  RuntimeError *pRVar1;
  Value VVar2;
  allocator<char> local_41;
  string local_40;
  
  if (NAN(v)) {
    pRVar1 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"not a number",&local_41)
    ;
    Stack::makeError(pRVar1,&this->stack,loc,&local_40);
    __cxa_throw(pRVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (ABS(v) != INFINITY) {
    VVar2.v.d = INFINITY;
    VVar2._0_8_ = v;
    return VVar2;
  }
  pRVar1 = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"overflow",&local_41);
  Stack::makeError(pRVar1,&this->stack,loc,&local_40);
  __cxa_throw(pRVar1,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

Value makeNumberCheck(const LocationRange &loc, double v)
    {
        if (std::isnan(v)) {
            throw makeError(loc, "not a number");
        }
        if (std::isinf(v)) {
            throw makeError(loc, "overflow");
        }
        return makeNumber(v);
    }